

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

int cmp_init_el(void *p1,void *p2)

{
  mir_size_t mVar1;
  int local_40;
  int local_3c;
  int bit_offset2;
  int bit_offset1;
  init_el_t *el2;
  init_el_t *el1;
  void *p2_local;
  void *p1_local;
  
  if ((*(long *)((long)p1 + 0x18) == 0) || (*(int *)(*(long *)((long)p1 + 0x18) + 4) < 0)) {
    local_3c = 0;
  }
  else {
    local_3c = *(int *)(*(long *)((long)p1 + 0x18) + 4);
  }
  if ((*(long *)((long)p2 + 0x18) == 0) || (*(int *)(*(long *)((long)p2 + 0x18) + 4) < 0)) {
    local_40 = 0;
  }
  else {
    local_40 = *(int *)(*(long *)((long)p2 + 0x18) + 4);
  }
  if ((ulong)(*(long *)((long)p1 + 0x10) + (long)(local_3c / 8)) <
      (ulong)(*(long *)((long)p2 + 0x10) + (long)(local_40 / 8))) {
    p1_local._4_4_ = -1;
  }
  else if ((ulong)(*(long *)((long)p2 + 0x10) + (long)(local_40 / 8)) <
           (ulong)(*(long *)((long)p1 + 0x10) + (long)(local_3c / 8))) {
    p1_local._4_4_ = 1;
  }
  else if (((*(long *)((long)p1 + 0x18) == 0) || (*(long *)((long)p2 + 0x18) == 0)) ||
          (*(int *)(*(long *)((long)p2 + 0x18) + 4) <= *(int *)(*(long *)((long)p1 + 0x18) + 4))) {
    if (((*(long *)((long)p1 + 0x18) == 0) || (*(long *)((long)p2 + 0x18) == 0)) ||
       (*(int *)(*(long *)((long)p1 + 0x18) + 4) <= *(int *)(*(long *)((long)p2 + 0x18) + 4))) {
      if ((*(long *)((long)p1 + 0x18) != 0) &&
         (mVar1 = type_size(*p1,*(type **)(*(long *)((long)p1 + 0x18) + 0x40)), mVar1 == 0)) {
        return -1;
      }
      if ((*(long *)((long)p2 + 0x18) != 0) &&
         (mVar1 = type_size(*p2,*(type **)(*(long *)((long)p2 + 0x18) + 0x40)), mVar1 == 0)) {
        return 1;
      }
      if (*(ulong *)((long)p1 + 8) < *(ulong *)((long)p2 + 8)) {
        p1_local._4_4_ = -1;
      }
      else if (*(ulong *)((long)p2 + 8) < *(ulong *)((long)p1 + 8)) {
        p1_local._4_4_ = 1;
      }
      else {
        p1_local._4_4_ = 0;
      }
    }
    else {
      p1_local._4_4_ = 1;
    }
  }
  else {
    p1_local._4_4_ = -1;
  }
  return p1_local._4_4_;
}

Assistant:

static int cmp_init_el (const void *p1, const void *p2) {
  const init_el_t *el1 = p1, *el2 = p2;
  int bit_offset1 = el1->member_decl == NULL || el1->member_decl->bit_offset < 0
                      ? 0
                      : el1->member_decl->bit_offset;
  int bit_offset2 = el2->member_decl == NULL || el2->member_decl->bit_offset < 0
                      ? 0
                      : el2->member_decl->bit_offset;

  if (el1->offset + bit_offset1 / MIR_CHAR_BIT < el2->offset + bit_offset2 / MIR_CHAR_BIT)
    return -1;
  else if (el1->offset + bit_offset1 / MIR_CHAR_BIT > el2->offset + bit_offset2 / MIR_CHAR_BIT)
    return 1;
  else if (el1->member_decl != NULL && el2->member_decl != NULL
           && el1->member_decl->bit_offset < el2->member_decl->bit_offset)
    return -1;
  else if (el1->member_decl != NULL && el2->member_decl != NULL
           && el1->member_decl->bit_offset > el2->member_decl->bit_offset)
    return 1;
  else if (el1->member_decl != NULL
           && type_size (el1->c2m_ctx, el1->member_decl->decl_spec.type) == 0)
    return -1;
  else if (el2->member_decl != NULL
           && type_size (el2->c2m_ctx, el2->member_decl->decl_spec.type) == 0)
    return 1;
  else if (el1->num < el2->num)
    return -1;
  else if (el1->num > el2->num)
    return 1;
  else
    return 0;
}